

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsbfs.cpp
# Opt level: O3

void count_components(void)

{
  int iVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  freopen("components.txt","w",_stdout);
  iVar3 = 0;
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)&(anonymous_namespace)::useddfs,(long)V,false);
  if (0 < V) {
    uVar5 = 0;
    iVar3 = 0;
    lVar2 = (anonymous_namespace)::useddfs;
    iVar1 = V;
    do {
      if ((*(ulong *)(lVar2 + (uVar5 >> 6) * 8) >> (uVar5 & 0x3f) & 1) == 0) {
        if (DAT_001193c0 != (anonymous_namespace)::comp) {
          DAT_001193c0 = (anonymous_namespace)::comp;
        }
        dfs(0);
        iVar3 = iVar3 + 1;
        lVar2 = (anonymous_namespace)::useddfs;
        iVar1 = V;
      }
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
    } while ((int)uVar4 < iVar1);
  }
  std::ostream::operator<<((ostream *)&std::cout,iVar3);
  return;
}

Assistant:

void count_components() {
    freopen("components.txt", "w", stdout); // output file

    int comp_num = 0;
    useddfs.resize(V, false);
    for (int i = 0; i < V; i++) {
        if (!useddfs[i]) {
            comp.clear();
            dfs(i);
            comp_num++;
        }
    }
    cout << comp_num;
}